

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O0

void QGraphicsOpacityEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  qreal qVar2;
  void *_v_1;
  void *_v;
  QGraphicsOpacityEffect *_t;
  QBrush *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  QBrush *in_stack_ffffffffffffff98;
  QGraphicsOpacityEffect *in_stack_ffffffffffffffa0;
  qreal *in_stack_ffffffffffffffa8;
  QBrush local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff98 = (QBrush *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff98) {
    case (QBrush *)0x0:
      opacityChanged((QGraphicsOpacityEffect *)0x4a6cc9,(qreal)in_stack_ffffffffffffff88);
      break;
    case (QBrush *)0x1:
      opacityMaskChanged((QGraphicsOpacityEffect *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
      break;
    case (QBrush *)0x2:
      setOpacity((QGraphicsOpacityEffect *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (qreal)in_stack_ffffffffffffffa8);
      break;
    case (QBrush *)0x3:
      setOpacityMask(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  if ((in_ESI != 5) ||
     ((bVar1 = QtMocHelpers::indexOfMethod<void(QGraphicsOpacityEffect::*)(double)>
                         (in_RCX,(void **)opacityChanged,0,0), !bVar1 &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QGraphicsOpacityEffect::*)(QBrush_const&)>
                         (in_RCX,(void **)opacityMaskChanged,0,1), !bVar1)))) {
    if (in_ESI == 1) {
      in_stack_ffffffffffffffa8 = *(qreal **)in_RCX;
      in_stack_ffffffffffffff94 = in_EDX;
      if (in_EDX == 0) {
        qVar2 = opacity((QGraphicsOpacityEffect *)(ulong)in_stack_ffffffffffffff90);
        *in_stack_ffffffffffffffa8 = qVar2;
      }
      else if (in_EDX == 1) {
        opacityMask((QGraphicsOpacityEffect *)in_stack_ffffffffffffff98);
        QBrush::operator=((QBrush *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
        QBrush::~QBrush(local_10);
      }
    }
    if (in_ESI == 2) {
      if (in_EDX == 0) {
        setOpacity((QGraphicsOpacityEffect *)((ulong)in_stack_ffffffffffffff94 << 0x20),
                   (qreal)in_stack_ffffffffffffffa8);
      }
      else if (in_EDX == 1) {
        setOpacityMask(*(QGraphicsOpacityEffect **)in_RCX,in_stack_ffffffffffffff98);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsOpacityEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsOpacityEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->opacityChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->opacityMaskChanged((*reinterpret_cast< std::add_pointer_t<QBrush>>(_a[1]))); break;
        case 2: _t->setOpacity((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 3: _t->setOpacityMask((*reinterpret_cast< std::add_pointer_t<QBrush>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsOpacityEffect::*)(qreal )>(_a, &QGraphicsOpacityEffect::opacityChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsOpacityEffect::*)(const QBrush & )>(_a, &QGraphicsOpacityEffect::opacityMaskChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<qreal*>(_v) = _t->opacity(); break;
        case 1: *reinterpret_cast<QBrush*>(_v) = _t->opacityMask(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOpacity(*reinterpret_cast<qreal*>(_v)); break;
        case 1: _t->setOpacityMask(*reinterpret_cast<QBrush*>(_v)); break;
        default: break;
        }
    }
}